

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O2

void __thiscall nite::Batch::~Batch(Batch *this)

{
  unload(this);
  std::_Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::~_Vector_base
            ((_Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_> *)this);
  return;
}

Assistant:

nite::Batch::~Batch(){
	unload();
}